

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
 __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::connectToIntroduced
          (ConnectionImpl *this,Reader contact,Builder completion)

{
  undefined8 uVar1;
  undefined8 uVar2;
  sockaddr *__addr;
  Connection *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  MVar3;
  ArrayPtr<const_char> local_90;
  DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> _kjCondition;
  Reader local_50;
  
  local_90 = (ArrayPtr<const_char>)
             capnproto_test::capnp::test::TestThirdPartyToContact::Reader::getSentBy(&contact);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            (&_kjCondition,(DebugExpression<capnp::Text::Reader> *)&local_90,
             (StringPtr *)(in_RSI + 0xb8));
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"contact.getSentBy() == partnerName\", _kjCondition",
               (char (*) [52])"failed: expected contact.getSentBy() == partnerName",&_kjCondition);
  }
  if (contact._reader.dataSize < 0x40) {
    uVar2 = 0;
  }
  else {
    uVar2 = *contact._reader.data;
  }
  *(undefined8 *)completion._builder.data = uVar2;
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  capnproto_test::capnp::test::TestThirdPartyToContact::Reader::getPath(&local_50,&contact);
  connect((TestVat *)this,(int)uVar1,__addr,(socklen_t)uVar2);
  MVar3.ptr.ptr = extraout_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
          )MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connectToIntroduced(
        test::TestThirdPartyToContact::Reader contact,
        test::TestThirdPartyCompletion::Builder completion) override {
      KJ_EXPECT(contact.getSentBy() == partnerName);
      completion.setToken(contact.getToken());
      return vat.connect(contact.getPath());
    }